

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_package.c
# Opt level: O0

char * mksymname(lua_State *L,char *modname,char *prefix)

{
  char *pcVar1;
  lua_State *L_00;
  char *in_RDX;
  char *in_RSI;
  lua_State *in_RDI;
  char *mark;
  char *funcname;
  char *in_stack_00001ff8;
  char *in_stack_00002000;
  char *in_stack_00002008;
  lua_State *in_stack_00002010;
  int idx;
  
  pcVar1 = strchr(in_RSI,0x2d);
  idx = (int)((ulong)pcVar1 >> 0x20);
  pcVar1 = luaL_gsub(in_stack_00002010,in_stack_00002008,in_stack_00002000,in_stack_00001ff8);
  L_00 = (lua_State *)lua_pushfstring(in_RDI,in_RDX,pcVar1);
  lua_remove(L_00,idx);
  return (char *)L_00;
}

Assistant:

static const char *mksymname(lua_State *L, const char *modname,
			     const char *prefix)
{
  const char *funcname;
  const char *mark = strchr(modname, *LUA_IGMARK);
  if (mark) modname = mark + 1;
  funcname = luaL_gsub(L, modname, ".", "_");
  funcname = lua_pushfstring(L, prefix, funcname);
  lua_remove(L, -2);  /* remove 'gsub' result */
  return funcname;
}